

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3813.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementHexaANCF_3813::T0DetJElementCenterForEAS
          (ChElementHexaANCF_3813 *this,ChMatrixNM<double,_8,_3> *d0,ChMatrixNM<double,_6,_6> *T0,
          double *detJ0C)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  double dVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  double dVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  double dVar32;
  undefined1 auVar33 [16];
  double dVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  double dVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  double dVar41;
  undefined1 auVar42 [16];
  double dVar43;
  undefined1 auVar44 [16];
  double dVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  ChMatrixNM<double,_3,_3> rd0;
  ChMatrixNM<double,_3,_3> j0;
  assign_op<double,_double> local_109;
  double local_108;
  double local_100;
  double local_f8;
  double local_f0;
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  double local_c0;
  double local_b8;
  double local_b0;
  SrcXprType local_a8;
  undefined1 local_a0 [16];
  undefined8 local_90;
  undefined8 uStack_88;
  undefined1 local_80 [16];
  double local_68;
  double local_60;
  Matrix<double,_3,_3,_1,_3,_3> local_58;
  
  local_e8._8_8_ = local_e8._0_8_;
  local_d8._8_8_ = local_d8._0_8_;
  dVar45 = (2.0 / (this->m_InertFlexVec).m_data[1]) * 0.125;
  auVar14._8_8_ = 0x8000000000000000;
  auVar14._0_8_ = 0x8000000000000000;
  auVar46._8_8_ = 0;
  auVar46._0_8_ = dVar45;
  auVar1 = vmovddup_avx512vl(auVar46);
  auVar2 = vxorpd_avx512vl(auVar1,auVar14);
  dVar41 = (2.0 / (this->m_InertFlexVec).m_data[0]) * 0.125;
  auVar16 = *(undefined1 (*) [16])
             ((d0->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.m_data.
              array + 0x15);
  auVar15 = *(undefined1 (*) [16])
             ((d0->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.m_data.
              array + 0x12);
  auVar4._8_8_ = dVar41;
  auVar4._0_8_ = dVar41;
  auVar14 = *(undefined1 (*) [16])
             ((d0->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.m_data.
              array + 0xf);
  auVar13 = *(undefined1 (*) [16])
             ((d0->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.m_data.
              array + 0xc);
  auVar12 = *(undefined1 (*) [16])
             ((d0->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.m_data.
              array + 9);
  auVar11 = *(undefined1 (*) [16])
             ((d0->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.m_data.
              array + 6);
  auVar10 = *(undefined1 (*) [16])
             ((d0->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.m_data.
              array + 3);
  auVar9 = *(undefined1 (*) [16])
            (d0->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.m_data.
            array;
  auVar3 = vmulpd_avx512vl(auVar4,auVar9);
  auVar3 = vfmsub231pd_avx512vl(auVar3,auVar10,auVar4);
  auVar3 = vfmadd231pd_avx512vl(auVar3,auVar11,auVar4);
  auVar3 = vfnmadd231pd_avx512vl(auVar3,auVar12,auVar4);
  auVar3 = vfnmadd231pd_avx512vl(auVar3,auVar13,auVar4);
  auVar3 = vfmadd231pd_avx512vl(auVar3,auVar14,auVar4);
  auVar3 = vfmadd231pd_avx512vl(auVar3,auVar15,auVar4);
  auVar3 = vfnmadd231pd_avx512vl(auVar3,auVar16,auVar4);
  dVar17 = (d0->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.m_data.array
           [2];
  auVar60._8_8_ = 0;
  auVar60._0_8_ = dVar17;
  dVar23 = (d0->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.m_data.array
           [5];
  auVar63._8_8_ = 0;
  auVar63._0_8_ = dVar23;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = dVar41;
  auVar4 = vmulsd_avx512f(auVar7,auVar60);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = dVar23 * dVar41;
  auVar4 = vsubsd_avx512f(auVar6,auVar4);
  dVar26 = (d0->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.m_data.array
           [8];
  auVar65._8_8_ = 0;
  auVar65._0_8_ = dVar26;
  auVar5 = vmulsd_avx512f(auVar7,auVar65);
  dVar32 = (d0->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.m_data.array
           [0xb];
  auVar69._8_8_ = 0;
  auVar69._0_8_ = dVar32;
  auVar6 = vmulsd_avx512f(auVar7,auVar69);
  auVar5 = vsubsd_avx512f(auVar5,auVar6);
  auVar4 = vaddsd_avx512f(auVar4,auVar5);
  dVar34 = (d0->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.m_data.array
           [0xe];
  dVar38 = (d0->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.m_data.array
           [0x11];
  auVar77._8_8_ = 0;
  auVar77._0_8_ = dVar38;
  auVar5 = vmulsd_avx512f(auVar7,auVar77);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = dVar41;
  auVar73._8_8_ = 0;
  auVar73._0_8_ = dVar34;
  auVar6 = vmulsd_avx512f(auVar8,auVar73);
  auVar5 = vsubsd_avx512f(auVar5,auVar6);
  dVar41 = (d0->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.m_data.array
           [0x14];
  auVar81._8_8_ = 0;
  auVar81._0_8_ = dVar41;
  auVar6 = vmulsd_avx512f(auVar8,auVar81);
  dVar43 = (d0->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.m_data.array
           [0x17];
  auVar85._8_8_ = 0;
  auVar85._0_8_ = dVar43;
  auVar7 = vmulsd_avx512f(auVar8,auVar85);
  auVar6 = vsubsd_avx512f(auVar6,auVar7);
  auVar5 = vaddsd_avx512f(auVar5,auVar6);
  auVar5 = vaddsd_avx512f(auVar4,auVar5);
  auVar4 = vmulpd_avx512vl(auVar1,auVar9);
  auVar4 = vfnmsub231pd_avx512vl(auVar4,auVar10,auVar1);
  auVar4 = vfmadd231pd_avx512vl(auVar4,auVar11,auVar1);
  auVar4 = vfmadd231pd_avx512vl(auVar4,auVar12,auVar1);
  auVar4 = vfnmadd231pd_avx512vl(auVar4,auVar13,auVar1);
  auVar4 = vfnmadd231pd_avx512vl(auVar4,auVar14,auVar1);
  auVar4 = vfmadd231pd_avx512vl(auVar4,auVar15,auVar1);
  auVar6 = vfmadd231pd_avx512vl(auVar4,auVar16,auVar1);
  local_a0 = vunpcklpd_avx512vl(auVar3,auVar6);
  auVar4 = vshufpd_avx512vl(auVar3,auVar3,1);
  vmovsd_avx512f(auVar5);
  auVar1 = vmulsd_avx512f(auVar63,auVar2);
  auVar7 = vmulsd_avx512f(auVar46,auVar60);
  auVar1 = vsubsd_avx512f(auVar1,auVar7);
  auVar47._8_8_ = 0;
  auVar47._0_8_ = dVar45;
  auVar7 = vmulsd_avx512f(auVar47,auVar65);
  auVar8 = vmulsd_avx512f(auVar47,auVar69);
  auVar7 = vaddsd_avx512f(auVar7,auVar8);
  auVar1 = vaddsd_avx512f(auVar1,auVar7);
  auVar2 = vmulsd_avx512f(auVar77,auVar2);
  auVar7 = vmulsd_avx512f(auVar47,auVar73);
  auVar2 = vsubsd_avx512f(auVar2,auVar7);
  auVar7 = vmulsd_avx512f(auVar47,auVar81);
  auVar48._8_8_ = 0;
  auVar48._0_8_ = dVar45;
  auVar8 = vmulsd_avx512f(auVar48,auVar85);
  auVar7 = vaddsd_avx512f(auVar7,auVar8);
  auVar49._8_8_ = 0;
  auVar49._0_8_ = auVar2._0_8_ + auVar7._0_8_;
  auVar2 = vaddsd_avx512f(auVar1,auVar49);
  auVar1 = vshufpd_avx(auVar6,auVar6,1);
  dVar45 = (2.0 / (this->m_InertFlexVec).m_data[2]) * 0.125;
  auVar52._8_8_ = dVar45;
  auVar52._0_8_ = dVar45;
  auVar9 = vmulpd_avx512vl(auVar52,auVar9);
  auVar10 = vfnmsub231pd_avx512vl(auVar9,auVar52,auVar10);
  auVar11 = vfnmadd231pd_avx512vl(auVar10,auVar52,auVar11);
  auVar12 = vfnmadd231pd_avx512vl(auVar11,auVar52,auVar12);
  auVar13 = vfmadd231pd_avx512vl(auVar12,auVar52,auVar13);
  auVar14 = vfmadd231pd_avx512vl(auVar13,auVar52,auVar14);
  auVar15 = vfmadd231pd_avx512vl(auVar14,auVar52,auVar15);
  auVar15 = vfmadd231pd_avx512vl(auVar15,auVar52,auVar16);
  local_80 = vunpckhpd_avx512vl(auVar6,auVar15);
  local_68 = auVar2._0_8_;
  auVar10._0_8_ = -dVar45;
  auVar10._8_8_ = -dVar45;
  auVar70._8_8_ = 0;
  auVar70._0_8_ = dVar32;
  auVar16 = vmulsd_avx512f(auVar70,auVar10);
  auVar39._8_8_ = 0;
  auVar39._0_8_ = dVar45;
  auVar74._8_8_ = 0;
  auVar74._0_8_ = dVar34;
  auVar14 = vmulsd_avx512f(auVar39,auVar74);
  auVar78._8_8_ = 0;
  auVar78._0_8_ = dVar38;
  auVar13 = vmulsd_avx512f(auVar39,auVar78);
  auVar82._8_8_ = 0;
  auVar82._0_8_ = dVar41;
  auVar12 = vmulsd_avx512f(auVar39,auVar82);
  auVar86._8_8_ = 0;
  auVar86._0_8_ = dVar43;
  auVar11 = vmulsd_avx512f(auVar39,auVar86);
  local_60 = (dVar23 * auVar10._0_8_ - dVar17 * dVar45) + (auVar16._0_8_ - dVar26 * dVar45) +
             auVar14._0_8_ + auVar13._0_8_ + auVar12._0_8_ + auVar11._0_8_;
  local_90 = auVar15._0_8_;
  uStack_88 = auVar3._8_8_;
  auVar14 = vshufpd_avx512vl(auVar15,auVar15,1);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = local_60;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = local_68 * auVar14._0_8_;
  auVar16 = vfmsub231sd_fma(auVar9,auVar1,auVar13);
  auVar16 = vmulsd_avx512f(auVar3,auVar16);
  auVar14 = vmulsd_avx512f(auVar5,auVar14);
  auVar14 = vfmsub231sd_avx512f(auVar14,auVar4,auVar13);
  auVar13 = vmulsd_avx512f(auVar5,auVar1);
  auVar13 = vfmsub231sd_avx512f(auVar13,auVar4,auVar2);
  auVar15 = vmulsd_avx512f(auVar15,auVar13);
  *detJ0C = auVar15._0_8_ + (auVar16._0_8_ - auVar6._0_8_ * auVar14._0_8_);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = local_80._0_8_;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = local_68;
  auVar16 = vmulsd_avx512f(auVar12,auVar5);
  auVar15 = vfmsub231sd_avx512f(auVar16,auVar4,auVar11);
  auVar16 = vmulsd_avx512f(auVar11,auVar3);
  auVar14 = vfmsub231sd_avx512f(auVar16,auVar5,auVar6);
  auVar16 = vmulsd_avx512f(auVar6,auVar4);
  auVar16 = vfmsub231sd_avx512f(auVar16,auVar3,auVar12);
  auVar13 = vmulsd_avx512f(auVar4,auVar4);
  auVar13 = vfmadd231sd_avx512f(auVar13,auVar3,auVar3);
  auVar13 = vfmadd231sd_avx512f(auVar13,auVar5,auVar5);
  local_f0 = auVar15._0_8_;
  local_f8 = auVar14._0_8_;
  local_100 = auVar16._0_8_;
  if (auVar13._0_8_ < 0.0) {
    vmovsd_avx512f(auVar5);
    local_e8 = auVar4;
    local_d8 = auVar3;
    dVar17 = sqrt(auVar13._0_8_);
    auVar16._8_8_ = 0;
    auVar16._0_8_ = local_100;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = local_f0;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = local_108;
    auVar3 = local_d8;
    auVar4 = local_e8;
  }
  else {
    auVar14 = vsqrtsd_avx(auVar13,auVar13);
    dVar17 = auVar14._0_8_;
  }
  auVar18._0_8_ = 1.0 / dVar17;
  auVar18._8_8_ = 0;
  auVar1 = vmulsd_avx512f(auVar3,auVar18);
  auVar3 = vmulsd_avx512f(auVar4,auVar18);
  auVar2 = vmulsd_avx512f(auVar5,auVar18);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = local_f8 * local_f8;
  auVar14 = vfmadd231sd_fma(auVar19,auVar15,auVar15);
  auVar14 = vfmadd231sd_fma(auVar14,auVar16,auVar16);
  if (auVar14._0_8_ < 0.0) {
    local_d8._0_8_ = auVar1._0_8_;
    local_108 = auVar3._0_8_;
    local_e8._0_8_ = auVar2._0_8_;
    dVar17 = sqrt(auVar14._0_8_);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = local_e8._0_8_;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = local_108;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_d8._0_8_;
  }
  else {
    auVar14 = vsqrtsd_avx(auVar14,auVar14);
    dVar17 = auVar14._0_8_;
    local_f0 = auVar15._0_8_;
    local_100 = auVar16._0_8_;
  }
  dVar17 = 1.0 / dVar17;
  local_d8._0_8_ = local_f0 * dVar17;
  local_f8 = local_f8 * dVar17;
  local_f0 = local_100 * dVar17;
  dVar23 = auVar3._0_8_;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = dVar23 * local_f0;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = local_f8;
  auVar16 = vfmsub231sd_fma(auVar20,auVar35,auVar2);
  dVar26 = auVar2._0_8_;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = dVar26 * (double)local_d8._0_8_;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = local_f0;
  auVar15 = vfmsub231sd_fma(auVar24,auVar27,auVar1);
  dVar17 = auVar1._0_8_;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = dVar17 * local_f8;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = local_d8._0_8_;
  auVar14 = vfmsub231sd_fma(auVar28,auVar33,auVar3);
  local_100 = dVar17 + auVar16._0_8_ * 0.0;
  local_b8 = dVar23 + auVar15._0_8_ * 0.0;
  local_108 = dVar26 + auVar14._0_8_ * 0.0;
  local_e8._0_8_ = auVar16._0_8_ - dVar17 * 0.0;
  local_c0 = auVar15._0_8_ - dVar23 * 0.0;
  local_b0 = auVar14._0_8_ - dVar26 * 0.0;
  local_a8.m_xpr = (XprTypeNested)local_a0;
  Eigen::internal::
  Assignment<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Inverse<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
  ::run(&local_58,&local_a8,&local_109);
  auVar42._8_8_ = 0;
  auVar42._0_8_ =
       local_58.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
       [3];
  auVar53._8_8_ = 0;
  auVar53._0_8_ =
       local_58.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
       [6];
  auVar21._8_8_ = 0;
  auVar21._0_8_ =
       local_58.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
       [0];
  auVar25._8_8_ = 0;
  auVar25._0_8_ =
       local_58.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
       [1];
  auVar36._8_8_ = 0;
  auVar36._0_8_ =
       local_58.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
       [4];
  auVar50._8_8_ = 0;
  auVar50._0_8_ =
       local_58.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
       [7];
  auVar44._8_8_ = 0;
  auVar44._0_8_ =
       local_58.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
       [2];
  auVar59._8_8_ = 0;
  auVar59._0_8_ =
       local_58.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
       [5];
  auVar61._8_8_ = 0;
  auVar61._0_8_ =
       local_58.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
       [8];
  auVar79._8_8_ = 0;
  auVar79._0_8_ = local_b8;
  auVar16 = vmulsd_avx512f(auVar79,auVar25);
  auVar66._8_8_ = 0;
  auVar66._0_8_ = local_100;
  auVar16 = vfmadd231sd_fma(auVar16,auVar66,auVar21);
  auVar67._8_8_ = 0;
  auVar67._0_8_ = local_108;
  auVar12 = vfmadd231sd_avx512f(auVar16,auVar67,auVar44);
  auVar83._8_8_ = 0;
  auVar83._0_8_ = local_c0;
  auVar16 = vmulsd_avx512f(auVar83,auVar25);
  auVar71._8_8_ = 0;
  auVar71._0_8_ = local_e8._0_8_;
  auVar16 = vfmadd231sd_avx512f(auVar16,auVar71,auVar21);
  auVar75._8_8_ = 0;
  auVar75._0_8_ = local_b0;
  auVar11 = vfmadd231sd_avx512f(auVar16,auVar75,auVar44);
  auVar64._8_8_ = 0;
  auVar64._0_8_ = local_d8._0_8_;
  auVar40._8_8_ = 0;
  auVar40._0_8_ =
       local_f8 *
       local_58.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
       [1];
  auVar16 = vfmadd231sd_fma(auVar40,auVar64,auVar21);
  auVar62._8_8_ = 0;
  auVar62._0_8_ = local_f0;
  auVar16 = vfmadd231sd_fma(auVar16,auVar62,auVar44);
  auVar15 = vmulsd_avx512f(auVar79,auVar36);
  auVar15 = vfmadd231sd_fma(auVar15,auVar66,auVar42);
  auVar10 = vfmadd231sd_avx512f(auVar15,auVar67,auVar59);
  auVar15 = vmulsd_avx512f(auVar83,auVar36);
  auVar15 = vfmadd231sd_avx512f(auVar15,auVar71,auVar42);
  auVar9 = vfmadd231sd_avx512f(auVar15,auVar75,auVar59);
  auVar37._8_8_ = 0;
  auVar37._0_8_ =
       local_f8 *
       local_58.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
       [4];
  auVar15 = vfmadd231sd_fma(auVar37,auVar64,auVar42);
  auVar15 = vfmadd231sd_fma(auVar15,auVar62,auVar59);
  auVar80._8_8_ = 0;
  auVar80._0_8_ = local_b8;
  auVar14 = vmulsd_avx512f(auVar80,auVar50);
  auVar14 = vfmadd231sd_fma(auVar14,auVar53,auVar66);
  auVar68._8_8_ = 0;
  auVar68._0_8_ = local_108;
  auVar1 = vfmadd231sd_avx512f(auVar14,auVar61,auVar68);
  auVar84._8_8_ = 0;
  auVar84._0_8_ = local_c0;
  auVar14 = vmulsd_avx512f(auVar84,auVar50);
  auVar72._8_8_ = 0;
  auVar72._0_8_ = local_e8._0_8_;
  auVar14 = vfmadd231sd_avx512f(auVar14,auVar53,auVar72);
  auVar76._8_8_ = 0;
  auVar76._0_8_ = local_b0;
  auVar3 = vfmadd231sd_avx512f(auVar14,auVar61,auVar76);
  auVar51._8_8_ = 0;
  auVar51._0_8_ =
       local_f8 *
       local_58.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
       [7];
  auVar14 = vfmadd231sd_fma(auVar51,auVar64,auVar53);
  auVar14 = vfmadd231sd_fma(auVar14,auVar62,auVar61);
  dVar26 = auVar12._0_8_;
  (T0->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0] =
       dVar26 * dVar26;
  dVar32 = auVar11._0_8_;
  (T0->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[6] =
       dVar32 * dVar32;
  (T0->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0xc] =
       (dVar26 + dVar26) * dVar32;
  dVar38 = auVar16._0_8_;
  (T0->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0x12] =
       dVar38 * dVar38;
  (T0->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0x18] =
       (dVar26 + dVar26) * dVar38;
  (T0->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0x1e] =
       (dVar32 + dVar32) * dVar38;
  dVar17 = auVar10._0_8_;
  (T0->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[1] =
       dVar17 * dVar17;
  dVar23 = auVar9._0_8_;
  (T0->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[7] =
       dVar23 * dVar23;
  (T0->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0xd] =
       (dVar17 + dVar17) * dVar23;
  dVar34 = auVar15._0_8_;
  (T0->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0x13] =
       dVar34 * dVar34;
  (T0->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0x19] =
       (dVar17 + dVar17) * dVar34;
  (T0->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0x1f] =
       (dVar23 + dVar23) * dVar34;
  (T0->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[2] =
       dVar26 * dVar17;
  (T0->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[8] =
       dVar32 * dVar23;
  auVar54._8_8_ = 0;
  auVar54._0_8_ = dVar32 * dVar17;
  auVar13 = vfmadd231sd_fma(auVar54,auVar12,auVar9);
  (T0->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0xe] =
       auVar13._0_8_;
  (T0->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0x14] =
       dVar38 * dVar34;
  auVar55._8_8_ = 0;
  auVar55._0_8_ = dVar38 * dVar17;
  auVar15 = vfmadd231sd_fma(auVar55,auVar12,auVar15);
  (T0->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0x1a] =
       auVar15._0_8_;
  auVar56._8_8_ = 0;
  auVar56._0_8_ = dVar32 * dVar34;
  auVar16 = vfmadd231sd_fma(auVar56,auVar16,auVar9);
  (T0->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0x20] =
       auVar16._0_8_;
  dVar41 = auVar1._0_8_;
  (T0->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[3] =
       dVar41 * dVar41;
  dVar43 = auVar3._0_8_;
  (T0->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[9] =
       dVar43 * dVar43;
  (T0->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0xf] =
       (dVar41 + dVar41) * dVar43;
  dVar45 = auVar14._0_8_;
  (T0->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0x15] =
       dVar45 * dVar45;
  (T0->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0x1b] =
       dVar45 * (dVar41 + dVar41);
  (T0->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0x21] =
       dVar45 * (dVar43 + dVar43);
  (T0->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[4] =
       dVar26 * dVar41;
  (T0->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[10] =
       dVar32 * dVar43;
  auVar57._8_8_ = 0;
  auVar57._0_8_ = dVar32 * dVar41;
  auVar16 = vfmadd231sd_fma(auVar57,auVar12,auVar3);
  (T0->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0x10] =
       auVar16._0_8_;
  (T0->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0x16] =
       dVar45 * dVar38;
  auVar58._8_8_ = 0;
  auVar58._0_8_ = dVar38 * dVar41;
  auVar16 = vfmadd231sd_fma(auVar58,auVar14,auVar12);
  (T0->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0x1c] =
       auVar16._0_8_;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = dVar38 * dVar43;
  auVar16 = vfmadd231sd_fma(auVar29,auVar14,auVar11);
  (T0->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0x22] =
       auVar16._0_8_;
  (T0->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[5] =
       dVar17 * dVar41;
  (T0->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0xb] =
       dVar23 * dVar43;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = dVar23 * dVar41;
  auVar16 = vfmadd231sd_fma(auVar30,auVar10,auVar3);
  (T0->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0x11] =
       auVar16._0_8_;
  (T0->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0x17] =
       dVar45 * dVar34;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = dVar34 * dVar41;
  auVar16 = vfmadd231sd_fma(auVar31,auVar14,auVar10);
  (T0->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0x1d] =
       auVar16._0_8_;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = dVar34 * dVar43;
  auVar16 = vfmadd231sd_fma(auVar22,auVar9,auVar14);
  (T0->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0x23] =
       auVar16._0_8_;
  return;
}

Assistant:

void ChElementHexaANCF_3813::T0DetJElementCenterForEAS(ChMatrixNM<double, 8, 3>& d0,
                                                       ChMatrixNM<double, 6, 6>& T0,
                                                       double& detJ0C) {
    ShapeVector Nx;
    ShapeVector Ny;
    ShapeVector Nz;
    ShapeFunctionsDerivativeX(Nx, 0, 0, 0);
    ShapeFunctionsDerivativeY(Ny, 0, 0, 0);
    ShapeFunctionsDerivativeZ(Nz, 0, 0, 0);

    ChMatrixNM<double, 3, 3> rd0;
    rd0.col(0) = d0.transpose() * Nx.transpose();
    rd0.col(1) = d0.transpose() * Ny.transpose();
    rd0.col(2) = d0.transpose() * Nz.transpose();
    detJ0C = rd0.determinant();

    // Transformation : Orthogonal transformation (A and J) ////
    ChVector<double> G1;
    ChVector<double> G2;
    ChVector<double> G3;
    ChVector<double> G1xG2;
    G1[0] = rd0(0, 0);
    G2[0] = rd0(0, 1);
    G3[0] = rd0(0, 2);
    G1[1] = rd0(1, 0);
    G2[1] = rd0(1, 1);
    G3[1] = rd0(1, 2);
    G1[2] = rd0(2, 0);
    G2[2] = rd0(2, 1);
    G3[2] = rd0(2, 2);
    G1xG2.Cross(G1, G2);

    // Tangent Frame
    ChVector<> A1 = G1 / sqrt(G1[0] * G1[0] + G1[1] * G1[1] + G1[2] * G1[2]);
    ChVector<> A3 = G1xG2 / sqrt(G1xG2[0] * G1xG2[0] + G1xG2[1] * G1xG2[1] + G1xG2[2] * G1xG2[2]);
    ChVector<> A2 = A3.Cross(A1);
    double theta = 0.0;
    ChVector<> AA1 = A1 * cos(theta) + A2 * sin(theta);
    ChVector<> AA2 = -A1 * sin(theta) + A2 * cos(theta);
    ChVector<> AA3 = A3;

    // Beta
    ChMatrixNM<double, 3, 3> j0 = rd0.inverse();
    ChVector<double> j01;
    ChVector<double> j02;
    ChVector<double> j03;
    j01[0] = j0(0, 0);
    j02[0] = j0(1, 0);
    j03[0] = j0(2, 0);
    j01[1] = j0(0, 1);
    j02[1] = j0(1, 1);
    j03[1] = j0(2, 1);
    j01[2] = j0(0, 2);
    j02[2] = j0(1, 2);
    j03[2] = j0(2, 2);
    ChVectorN<double, 9> beta;
    beta(0) = Vdot(AA1, j01);
    beta(1) = Vdot(AA2, j01);
    beta(2) = Vdot(AA3, j01);
    beta(3) = Vdot(AA1, j02);
    beta(4) = Vdot(AA2, j02);
    beta(5) = Vdot(AA3, j02);
    beta(6) = Vdot(AA1, j03);
    beta(7) = Vdot(AA2, j03);
    beta(8) = Vdot(AA3, j03);

    T0(0, 0) = pow(beta(0), 2);
    T0(1, 0) = pow(beta(1), 2);
    T0(2, 0) = 2.0 * beta(0) * beta(1);
    T0(3, 0) = pow(beta(2), 2);
    T0(4, 0) = 2.0 * beta(0) * beta(2);
    T0(5, 0) = 2.0 * beta(1) * beta(2);

    T0(0, 1) = pow(beta(3), 2);
    T0(1, 1) = pow(beta(4), 2);
    T0(2, 1) = 2.0 * beta(3) * beta(4);
    T0(3, 1) = pow(beta(5), 2);
    T0(4, 1) = 2.0 * beta(3) * beta(5);
    T0(5, 1) = 2.0 * beta(4) * beta(5);

    T0(0, 2) = beta(0) * beta(3);
    T0(1, 2) = beta(1) * beta(4);
    T0(2, 2) = beta(0) * beta(4) + beta(1) * beta(3);
    T0(3, 2) = beta(2) * beta(5);
    T0(4, 2) = beta(0) * beta(5) + beta(2) * beta(3);
    T0(5, 2) = beta(2) * beta(4) + beta(1) * beta(5);

    T0(0, 3) = pow(beta(6), 2);
    T0(1, 3) = pow(beta(7), 2);
    T0(2, 3) = 2.0 * beta(6) * beta(7);
    T0(3, 3) = pow(beta(8), 2);
    T0(4, 3) = 2.0 * beta(6) * beta(8);
    T0(5, 3) = 2.0 * beta(7) * beta(8);

    T0(0, 4) = beta(0) * beta(6);
    T0(1, 4) = beta(1) * beta(7);
    T0(2, 4) = beta(0) * beta(7) + beta(6) * beta(1);
    T0(3, 4) = beta(2) * beta(8);
    T0(4, 4) = beta(0) * beta(8) + beta(2) * beta(6);
    T0(5, 4) = beta(1) * beta(8) + beta(2) * beta(7);

    T0(0, 5) = beta(3) * beta(6);
    T0(1, 5) = beta(4) * beta(7);
    T0(2, 5) = beta(3) * beta(7) + beta(4) * beta(6);
    T0(3, 5) = beta(5) * beta(8);
    T0(4, 5) = beta(3) * beta(8) + beta(6) * beta(5);
    T0(5, 5) = beta(4) * beta(8) + beta(5) * beta(7);
}